

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O2

void __thiscall cfd::core::Psbt::SetGlobalXpubkey(Psbt *this,KeyData *key)

{
  bool bVar1;
  CfdException *pCVar2;
  uint32_t *puVar3;
  uint8_t xpub_key;
  vector<unsigned_char,_std::allocator<unsigned_char>_> fingerprint;
  vector<unsigned_int,_std::allocator<unsigned_int>_> num_list;
  ByteData key_top;
  Serializer builder;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_58;
  ByteData key_data;
  
  if (this->wally_psbt_pointer_ == (void *)0x0) {
    builder._vptr_Serializer = (_func_int **)0x4f1aab;
    builder.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = 0xc5a;
    builder.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = "SetGlobalXpubkey";
    logger::warn<>((CfdSourceLocation *)&builder,"psbt pointer is null");
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::__cxx11::string::string((string *)&builder,"psbt pointer is null.",(allocator *)&key_top)
    ;
    CfdException::CfdException(pCVar2,kCfdIllegalStateError,(string *)&builder);
    __cxa_throw(pCVar2,&CfdException::typeinfo,CfdException::~CfdException);
  }
  bVar1 = KeyData::HasExtPubkey(key);
  if (bVar1) {
    xpub_key = '\x01';
    ByteData::ByteData(&key_top,&xpub_key,1);
    KeyData::GetExtPubkey((ExtPubkey *)&builder,key);
    ExtPubkey::GetData((ByteData *)&fingerprint,(ExtPubkey *)&builder);
    ByteData::Concat<cfd::core::ByteData>(&key_data,&key_top,(ByteData *)&fingerprint);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&fingerprint.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    ExtPubkey::~ExtPubkey((ExtPubkey *)&builder);
    KeyData::GetFingerprint((ByteData *)&builder,key);
    ByteData::GetBytes(&fingerprint,(ByteData *)&builder);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&builder);
    KeyData::GetChildNumArray(&num_list,key);
    if (3 < (ulong)((long)fingerprint.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)fingerprint.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start)) {
      Serializer::Serializer
                (&builder,((int)num_list.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                           (int)num_list.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start & 0xfffffffcU) + 4);
      Serializer::AddDirectBytes
                (&builder,fingerprint.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start,4);
      for (puVar3 = (uint32_t *)
                    CONCAT44(num_list.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start._4_4_,
                             (int)num_list.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          puVar3 != (uint32_t *)
                    CONCAT44(num_list.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_finish._4_4_,
                             (int)num_list.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_finish); puVar3 = puVar3 + 1) {
        Serializer::AddDirectNumber(&builder,*puVar3);
      }
      Serializer::Output((ByteData *)&local_58,&builder);
      SetGlobalRecord(this,&key_data,(ByteData *)&local_58);
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_58);
      Serializer::~Serializer(&builder);
      ::std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                (&num_list.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&fingerprint.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&key_data);
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&key_top);
      return;
    }
    builder._vptr_Serializer = (_func_int **)0x4f1aab;
    builder.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = 0xc6a;
    builder.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = "SetGlobalXpubkey";
    logger::warn<>((CfdSourceLocation *)&builder,"psbt fingerprint size low 4 byte.");
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::__cxx11::string::string
              ((string *)&builder,"psbt fingerprint size low 4 byte.",(allocator *)&local_58);
    CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,(string *)&builder);
    __cxa_throw(pCVar2,&CfdException::typeinfo,CfdException::~CfdException);
  }
  builder._vptr_Serializer = (_func_int **)0x4f1aab;
  builder.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0xc5f;
  builder.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = "SetGlobalXpubkey";
  logger::warn<>((CfdSourceLocation *)&builder,"psbt global xpub can set only ExtPubkey.");
  pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::__cxx11::string::string
            ((string *)&builder,"psbt global xpub can set only ExtPubkey.",(allocator *)&key_top);
  CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,(string *)&builder);
  __cxa_throw(pCVar2,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

void Psbt::SetGlobalXpubkey(const KeyData &key) {
  struct wally_psbt *psbt_pointer;
  psbt_pointer = static_cast<struct wally_psbt *>(wally_psbt_pointer_);
  if (psbt_pointer == nullptr) {
    warn(CFD_LOG_SOURCE, "psbt pointer is null");
    throw CfdException(kCfdIllegalStateError, "psbt pointer is null.");
  }

  if (!key.HasExtPubkey()) {
    warn(CFD_LOG_SOURCE, "psbt global xpub can set only ExtPubkey.");
    throw CfdException(
        kCfdIllegalArgumentError, "psbt global xpub can set only ExtPubkey.");
  }
  uint8_t xpub_key = Psbt::kPsbtGlobalXpub;
  ByteData key_top(&xpub_key, 1);
  ByteData key_data = key_top.Concat(key.GetExtPubkey().GetData());

  auto fingerprint = key.GetFingerprint().GetBytes();
  auto num_list = key.GetChildNumArray();
  if (fingerprint.size() < 4) {
    warn(CFD_LOG_SOURCE, "psbt fingerprint size low 4 byte.");
    throw CfdException(
        kCfdIllegalArgumentError, "psbt fingerprint size low 4 byte.");
  }
  // if (num_list.empty()) {
  //   warn(CFD_LOG_SOURCE, "psbt empty bip32 path.");
  //   throw CfdException(kCfdIllegalArgumentError, "psbt empty bip32 path.");
  // }
  Serializer builder(4 + (static_cast<uint32_t>(num_list.size()) * 4));
  builder.AddDirectBytes(fingerprint.data(), 4);
  for (const auto child_num : num_list) {
    builder.AddDirectNumber(child_num);
  }
  SetGlobalRecord(key_data, builder.Output());
}